

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O1

int ptls_fusion_aesgcm_decrypt
              (ptls_fusion_aesgcm_context_t *_ctx,void *output,void *input,size_t inlen,__m128i ctr,
              void *_aad,size_t aadlen,void *tag)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  __m128i alVar4;
  undefined1 auVar5 [16];
  __m128i alVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  bool bVar13;
  bool bVar14;
  __m128i *palVar15;
  ulong uVar16;
  uint uVar17;
  undefined1 *puVar18;
  __m128i *palVar19;
  undefined1 (*pauVar20) [16];
  long lVar21;
  undefined1 (*pauVar22) [16];
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  size_t __n;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 (*local_110) [16];
  ulong local_f8;
  undefined8 uStack_f0;
  undefined1 local_b8 [16];
  uint8_t buf [16];
  __m128i gdatabuf [6];
  
  auVar35 = _DAT_0012b680;
  auVar7 = vpunpcklqdq_avx(ZEXT416((uint)((int)inlen * 8)),ZEXT416((uint)((int)ctr[1] * 8)));
  alVar6 = (__m128i)vpshufb_avx(auVar7,_DAT_0012b670);
  auVar5 = vpaddq_avx(in_ZMM0._0_16_,_DAT_0012b690);
  auVar38 = ZEXT1664(auVar5);
  auVar5 = vpshufb_avx(auVar5,_DAT_0012b680);
  auVar36 = ZEXT1664(auVar5 ^ (undefined1  [16])(_ctx->ecb).keys.m128[0]);
  lVar29 = (inlen * 2 + 0x1e & 0xffffffffffffffe0) + (ctr[1] * 2 + 0x1eU & 0xffffffffffffffe0) +
           0x240;
  bVar14 = true;
  bVar13 = true;
  lVar26 = 1;
  auVar50 = ZEXT1664((undefined1  [16])0x0);
  auVar5 = vpmovsxbq_avx(ZEXT216(1));
  auVar52 = ZEXT1664((undefined1  [16])0x0);
  auVar51 = ZEXT1664((undefined1  [16])0x0);
  auVar41 = ZEXT1664((undefined1  [16])0x0);
  auVar43 = ZEXT1664((undefined1  [16])0x0);
  auVar45 = ZEXT1664((undefined1  [16])0x0);
  auVar49 = ZEXT1664((undefined1  [16])0x0);
  auVar39 = ZEXT1664((undefined1  [16])0x0);
  local_b8 = (undefined1  [16])0x0;
  pauVar20 = (undefined1 (*) [16])input;
  __n = inlen;
  local_110 = (undefined1 (*) [16])ctr[0];
LAB_00105602:
  uVar24 = CONCAT44(0,(_ctx->ecb).rounds);
  uVar27 = ctr[1];
  do {
    auVar46 = auVar38._0_16_;
    if (uVar27 == 0) {
      if (inlen < 0x60) {
        uVar27 = 0;
        pauVar22 = local_110;
LAB_0010593b:
        local_110 = pauVar22;
        if (uVar27 < 6) {
          uVar25 = (ulong)input & 0xffffffff;
          local_f8 = inlen;
          uVar23 = 0;
          uVar28 = uVar27;
          uVar31 = inlen;
          do {
            uVar16 = uVar23;
            bVar32 = uVar31 < 0x10;
            uVar31 = uVar31 - 0x10;
            if (bVar32) {
              palVar19 = (__m128i *)((long)*(__m128i *)input + uVar16);
              if (inlen != uVar16) {
                puVar18 = (undefined1 *)((long)*(__m128i *)input + uVar16);
                uVar17 = (uint)puVar18;
                if (((uVar17 & 0xfff) < 0xff1) ||
                   (0x1000 < (((uint)uVar25 & 0xfff) + inlen) - uVar16)) {
                  alVar4 = *palVar19;
                }
                else {
                  alVar4 = (__m128i)vpshufb_avx(*(undefined1 (*) [16])
                                                 ((ulong)puVar18 & 0xfffffffffffffff0),
                                                *(undefined1 (*) [16])("" + (uVar17 & 0xf)));
                }
                auVar33 = vpand_avx((undefined1  [16])alVar4,
                                    *(undefined1 (*) [16])(loadn_mask + uVar16 + (0x20 - inlen)));
                *(undefined1 (*) [16])((long)gdatabuf[uVar27] + uVar16) = auVar33;
                palVar19 = (__m128i *)((long)*palVar19 + local_f8);
                uVar28 = uVar28 + 1;
              }
              uVar27 = uVar28;
              if ((uVar27 < 6) && (bVar14)) {
                gdatabuf[uVar27] = alVar6;
                bVar14 = false;
                uVar27 = uVar27 + 1;
              }
              palVar15 = gdatabuf;
              inlen = 0;
              input = palVar19;
              goto LAB_00105632;
            }
            puVar1 = (undefined8 *)((long)*(__m128i *)input + uVar16);
            uVar12 = puVar1[1];
            uVar28 = uVar28 + 1;
            puVar2 = (undefined8 *)((long)gdatabuf[uVar27] + uVar16);
            *puVar2 = *puVar1;
            puVar2[1] = uVar12;
            uVar25 = (ulong)((uint)uVar25 + 0x10);
            local_f8 = uVar31;
            uVar23 = uVar16 + 0x10;
          } while (uVar27 * 0x10 + uVar16 != 0x50);
          input = (void *)((long)*(__m128i *)((long)input + 0x10) + uVar16);
          palVar15 = gdatabuf;
          ctr[1] = 0;
          inlen = uVar31;
          lVar21 = lVar26;
          goto LAB_00105638;
        }
        palVar15 = gdatabuf;
      }
      else {
        inlen = inlen - 0x60;
        uVar27 = 6;
        palVar15 = (__m128i *)input;
        input = (__m128i *)((long)input + 0x60);
      }
LAB_00105632:
      ctr[1] = 0;
      lVar21 = lVar26;
      uVar28 = uVar27;
    }
    else {
      local_f8 = uVar24;
      lVar30 = 0;
      uVar28 = 0;
      uVar23 = (ulong)local_110 & 0xffffffff;
      ctr[1] = uVar27;
      do {
        bVar32 = (ulong)ctr[1] < 0x10;
        ctr[1] = ctr[1] - 0x10;
        if (bVar32) {
          pauVar22 = (undefined1 (*) [16])(*local_110 + uVar28);
          if (uVar28 == uVar27) {
            lVar26 = lVar26 - lVar30;
            uVar27 = -lVar30;
          }
          else {
            uVar17 = (uint)(*local_110 + uVar28);
            if (((uVar17 & 0xfff) < 0xff1) || (0x1000 < (((uint)uVar23 & 0xfff) + uVar27) - uVar28))
            {
              auVar33 = *pauVar22;
            }
            else {
              auVar33 = vpshufb_avx(*(undefined1 (*) [16])
                                     ((ulong)(*local_110 + uVar28) & 0xfffffffffffffff0),
                                    *(undefined1 (*) [16])("" + (uVar17 & 0xf)));
            }
            auVar33 = vpand_avx(auVar33,*(undefined1 (*) [16])
                                         (loadn_mask + uVar28 + (0x20 - uVar27)));
            uVar27 = 1 - lVar30;
            *(undefined1 (*) [16])((long)gdatabuf[0] + uVar28) = auVar33;
            lVar26 = (lVar26 - lVar30) + 1;
          }
          goto LAB_0010593b;
        }
        uVar12 = *(undefined8 *)((long)(*local_110 + uVar28) + 8);
        *(undefined8 *)((long)gdatabuf[0] + uVar28) = *(undefined8 *)(*local_110 + uVar28);
        *(undefined8 *)((long)gdatabuf[0] + uVar28 + 8) = uVar12;
        uVar23 = (ulong)((uint)uVar23 + 0x10);
        uVar28 = uVar28 + 0x10;
        lVar30 = lVar30 + -1;
      } while (uVar28 != 0x60);
      lVar21 = lVar26 - lVar30;
      local_110 = local_110 + 6;
      uVar28 = -lVar30;
      palVar15 = gdatabuf;
    }
LAB_00105638:
    if (lVar21 == 0) {
      auVar46 = vpaddq_avx(auVar46,auVar5);
      auVar33 = vpshufb_avx(auVar46,auVar35);
      auVar36 = ZEXT1664(auVar33 ^ (undefined1  [16])(_ctx->ecb).keys.m128[0]);
switchD_001058af_caseD_1:
      auVar46 = vpaddq_avx(auVar46,auVar5);
      auVar33 = vpshufb_avx(auVar46,auVar35);
      auVar39 = ZEXT1664(auVar33 ^ (undefined1  [16])(_ctx->ecb).keys.m128[0]);
      goto switchD_001058af_caseD_2;
    }
    switch(lVar21) {
    case 1:
      goto switchD_001058af_caseD_1;
    case 2:
switchD_001058af_caseD_2:
      auVar46 = vpaddq_avx(auVar46,auVar5);
      auVar33 = vpshufb_avx(auVar46,auVar35);
      auVar41 = ZEXT1664(auVar33 ^ (undefined1  [16])(_ctx->ecb).keys.m128[0]);
    case 3:
      auVar46 = vpaddq_avx(auVar46,auVar5);
      auVar33 = vpshufb_avx(auVar46,auVar35);
      auVar43 = ZEXT1664(auVar33 ^ (undefined1  [16])(_ctx->ecb).keys.m128[0]);
    case 4:
      auVar46 = vpaddq_avx(auVar46,auVar5);
      auVar33 = vpshufb_avx(auVar46,auVar35);
      auVar45 = ZEXT1664(auVar33 ^ (undefined1  [16])(_ctx->ecb).keys.m128[0]);
    case 5:
      auVar46 = vpaddq_avx(auVar46,auVar5);
      auVar38 = ZEXT1664(auVar46);
      auVar46 = vpshufb_avx(auVar46,auVar35);
      auVar49 = ZEXT1664(auVar46 ^ (undefined1  [16])(_ctx->ecb).keys.m128[0]);
    }
    if (uVar28 == 0) {
      uVar27 = 1;
    }
    else {
      local_f8 = uVar24;
      uVar27 = uVar28 + 1;
      lVar26 = lVar29 + -0x10;
      lVar30 = 0;
      do {
        auVar46 = *(undefined1 (*) [16])((long)&(_ctx->ecb).keys + lVar30 + 0x10);
        auVar33 = aesenc(auVar36._0_16_,auVar46);
        auVar36._0_32_ = ZEXT1632(auVar33);
        auVar33 = aesenc(auVar39._0_16_,auVar46);
        auVar39._0_32_ = ZEXT1632(auVar33);
        auVar33 = aesenc(auVar41._0_16_,auVar46);
        auVar41._0_32_ = ZEXT1632(auVar33);
        auVar33 = aesenc(auVar43._0_16_,auVar46);
        auVar43._0_32_ = ZEXT1632(auVar33);
        auVar33 = aesenc(auVar45._0_16_,auVar46);
        auVar45._0_32_ = ZEXT1632(auVar33);
        auVar46 = aesenc(auVar49._0_16_,auVar46);
        auVar49._0_32_ = ZEXT1632(auVar46);
        auVar46 = vpshufb_avx(*(undefined1 (*) [16])((long)*palVar15 + lVar30),auVar35);
        puVar3 = (ulong *)((long)_ctx + lVar26 + -0x10);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *puVar3;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = auVar46._0_8_;
        auVar33 = (undefined1  [16])0x0;
        for (uVar17 = 0; uVar17 < 0x40; uVar17 = uVar17 + 1) {
          if ((auVar37 & (undefined1  [16])0x1 << uVar17) != (undefined1  [16])0x0) {
            auVar33 = auVar33 ^ auVar47 << uVar17;
          }
        }
        auVar52 = ZEXT1664(auVar33 ^ auVar52._0_16_);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = puVar3[1];
        auVar40._8_8_ = 0;
        auVar40._0_8_ = auVar46._8_8_;
        auVar33 = (undefined1  [16])0x0;
        for (uVar17 = 0; uVar17 < 0x40; uVar17 = uVar17 + 1) {
          if ((auVar34 & (undefined1  [16])0x1 << uVar17) != (undefined1  [16])0x0) {
            auVar33 = auVar33 ^ auVar40 << uVar17;
          }
        }
        auVar51 = ZEXT1664(auVar33 ^ auVar51._0_16_);
        auVar33 = vpshufd_avx(auVar46,0xee);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = auVar33._0_8_ ^ auVar46._0_8_;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)((long)&(_ctx->ecb).keys + lVar26);
        auVar46 = (undefined1  [16])0x0;
        for (uVar17 = 0; uVar17 < 0x40; uVar17 = uVar17 + 1) {
          if ((auVar42 & (undefined1  [16])0x1 << uVar17) != (undefined1  [16])0x0) {
            auVar46 = auVar46 ^ auVar33 << uVar17;
          }
        }
        auVar50 = ZEXT1664(auVar46 ^ auVar50._0_16_);
        lVar30 = lVar30 + 0x10;
        lVar26 = lVar26 + -0x20;
      } while (uVar28 << 4 != lVar30);
      lVar29 = lVar29 + uVar28 * -0x20;
    }
    auVar33 = auVar51._0_16_;
    auVar46 = auVar52._0_16_;
    auVar37 = auVar50._0_16_;
    if (uVar27 < uVar24) {
      lVar26 = (uVar24 - 1) - uVar28;
      pauVar22 = (undefined1 (*) [16])((long)&(_ctx->ecb).keys + uVar28 * 0x10 + 0x10);
      do {
        auVar47 = *pauVar22;
        auVar34 = aesenc(auVar36._0_16_,auVar47);
        auVar36._0_32_ = ZEXT1632(auVar34);
        auVar34 = aesenc(auVar39._0_16_,auVar47);
        auVar39._0_32_ = ZEXT1632(auVar34);
        auVar34 = aesenc(auVar41._0_16_,auVar47);
        auVar41._0_32_ = ZEXT1632(auVar34);
        auVar34 = aesenc(auVar43._0_16_,auVar47);
        auVar43._0_32_ = ZEXT1632(auVar34);
        auVar34 = aesenc(auVar45._0_16_,auVar47);
        auVar45._0_32_ = ZEXT1632(auVar34);
        auVar47 = aesenc(auVar49._0_16_,auVar47);
        auVar49._0_32_ = ZEXT1632(auVar47);
        pauVar22 = pauVar22 + 1;
        lVar26 = lVar26 + -1;
        uVar27 = uVar24;
      } while (lVar26 != 0);
    }
    alVar4 = (_ctx->ecb).keys.m128[uVar27];
    auVar47 = aesenclast(auVar36._0_16_,(undefined1  [16])alVar4);
    auVar36._0_32_ = ZEXT1632(auVar47);
    auVar34 = aesenclast(auVar39._0_16_,(undefined1  [16])alVar4);
    auVar39._0_32_ = ZEXT1632(auVar34);
    auVar40 = aesenclast(auVar41._0_16_,(undefined1  [16])alVar4);
    auVar41._0_32_ = ZEXT1632(auVar40);
    auVar42 = aesenclast(auVar43._0_16_,(undefined1  [16])alVar4);
    auVar43._0_32_ = ZEXT1632(auVar42);
    auVar44 = aesenclast(auVar45._0_16_,(undefined1  [16])alVar4);
    auVar45._0_32_ = ZEXT1632(auVar44);
    auVar48 = aesenclast(auVar49._0_16_,(undefined1  [16])alVar4);
    auVar49._0_32_ = ZEXT1632(auVar48);
    if ((lVar21 == 0) && (0x5f < __n)) {
      *(undefined1 (*) [16])output = auVar47 ^ *pauVar20;
      *(undefined1 (*) [16])((long)output + 0x10) = auVar34 ^ pauVar20[1];
      *(undefined1 (*) [16])((long)output + 0x20) = auVar40 ^ pauVar20[2];
      *(undefined1 (*) [16])((long)output + 0x30) = auVar42 ^ pauVar20[3];
      *(undefined1 (*) [16])((long)output + 0x40) = auVar44 ^ pauVar20[4];
      *(undefined1 (*) [16])((long)output + 0x50) = auVar48 ^ pauVar20[5];
      output = (void *)((long)output + 0x60);
      pauVar20 = pauVar20 + 6;
      __n = __n - 0x60;
      lVar26 = 0;
      goto LAB_00105602;
    }
    if (bVar13) {
      local_b8 = auVar47;
    }
    bVar13 = false;
    lVar26 = 0;
    uVar27 = ctr[1];
    switch(lVar21) {
    case 0:
      goto switchD_00105b79_caseD_0;
    case 1:
      goto switchD_00105b79_caseD_1;
    case 2:
      goto switchD_00105b79_caseD_2;
    case 3:
      goto switchD_00105b79_caseD_3;
    case 4:
      goto switchD_00105b79_caseD_4;
    case 5:
      goto switchD_00105b79_caseD_5;
    }
  } while( true );
switchD_00105b79_caseD_0:
  if (__n < 0x11) {
LAB_00105c46:
    if (__n != 0) {
      if (__n == 0x10) {
        *(undefined1 (*) [16])output = auVar47 ^ *pauVar20;
      }
      else {
        uVar27 = (ulong)((uint)pauVar20 & 0xfff);
        if ((uVar27 < 0xff1) || (0x1000 < uVar27 + __n)) {
          auVar5 = *pauVar20;
        }
        else {
          auVar5 = vpshufb_avx(*(undefined1 (*) [16])((ulong)pauVar20 & 0xfffffffffffffff0),
                               *(undefined1 (*) [16])("" + ((uint)pauVar20 & 0xf)));
        }
        auVar5 = vpand_avx(auVar5,*(undefined1 (*) [16])(loadn_mask + (0x20 - __n)));
        buf = (uint8_t  [16])(auVar5 ^ auVar47);
        if (__n != 0) {
          memcpy(output,buf,__n);
        }
      }
    }
    if (bVar14) {
      if (lVar29 != 0x240) {
        __assert_fail("ghash_precompute - 1 == ctx->ghash",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/fusion.c"
                      ,0x341,
                      "int ptls_fusion_aesgcm_decrypt(ptls_fusion_aesgcm_context_t *, void *, const void *, size_t, __m128i, const void *, size_t, const void *)"
                     );
      }
      auVar35._8_8_ = 0;
      auVar35._0_8_ = _ctx[1].ecb.keys.m128[0][0];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = auVar7._0_8_;
      auVar5 = (undefined1  [16])0x0;
      for (uVar17 = 0; uVar17 < 0x40; uVar17 = uVar17 + 1) {
        if ((auVar35 & (undefined1  [16])0x1 << uVar17) != (undefined1  [16])0x0) {
          auVar5 = auVar5 ^ auVar44 << uVar17;
        }
      }
      auVar48._8_8_ = 0;
      auVar48._0_8_ = _ctx[1].ecb.keys.m128[0][1];
      auVar9._8_8_ = 0;
      auVar9._0_8_ = auVar7._8_8_;
      auVar35 = (undefined1  [16])0x0;
      for (uVar17 = 0; uVar17 < 0x40; uVar17 = uVar17 + 1) {
        if ((auVar48 & (undefined1  [16])0x1 << uVar17) != (undefined1  [16])0x0) {
          auVar35 = auVar35 ^ auVar9 << uVar17;
        }
      }
      auVar47 = vpshufd_avx(auVar7,0xee);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = auVar47._0_8_ ^ auVar7._0_8_;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = _ctx[1].ecb.keys.m128[1][0];
      auVar7 = (undefined1  [16])0x0;
      for (uVar17 = 0; uVar17 < 0x40; uVar17 = uVar17 + 1) {
        if ((auVar10 & (undefined1  [16])0x1 << uVar17) != (undefined1  [16])0x0) {
          auVar7 = auVar7 ^ auVar11 << uVar17;
        }
      }
      auVar46 = auVar46 ^ auVar5;
      auVar33 = auVar33 ^ auVar35;
      auVar37 = auVar37 ^ auVar7;
    }
    auVar5 = auVar33 ^ auVar46 ^ auVar37;
    auVar37 = vpslldq_avx(auVar5,8);
    auVar35 = vpsrldq_avx(auVar5,8);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = SUB168(auVar46 ^ auVar37,0);
    auVar5 = (undefined1  [16])0x0;
    for (uVar17 = 0; uVar17 < 0x40; uVar17 = uVar17 + 1) {
      if ((auVar7 & (undefined1  [16])0x1 << uVar17) != (undefined1  [16])0x0) {
        auVar5 = auVar5 ^ ZEXT816(0xc200000000000000) << uVar17;
      }
    }
    auVar7 = vpshufd_avx(auVar46 ^ auVar37,0x4e);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = SUB168(auVar5 ^ auVar7,0);
    auVar46 = (undefined1  [16])0x0;
    for (uVar17 = 0; uVar17 < 0x40; uVar17 = uVar17 + 1) {
      if ((auVar8 & (undefined1  [16])0x1 << uVar17) != (undefined1  [16])0x0) {
        auVar46 = auVar46 ^ ZEXT816(0xc200000000000000) << uVar17;
      }
    }
    auVar5 = vpshufd_avx(auVar5 ^ auVar7,0x4e);
    auVar5 = vpshufb_avx(auVar46 ^ auVar33 ^ auVar35 ^ auVar5,_DAT_0012b680);
    return (int)((auVar5 ^ local_b8) == *_aad);
  }
  auVar9 = *pauVar20;
  pauVar20 = pauVar20 + 1;
  *(undefined1 (*) [16])output = auVar47 ^ auVar9;
  output = (void *)((long)output + 0x10);
  __n = __n - 0x10;
switchD_00105b79_caseD_1:
  auVar47 = auVar34;
  if (__n < 0x11) goto LAB_00105c46;
  auVar47 = *pauVar20;
  pauVar20 = pauVar20 + 1;
  *(undefined1 (*) [16])output = auVar34 ^ auVar47;
  output = (void *)((long)output + 0x10);
  __n = __n - 0x10;
switchD_00105b79_caseD_2:
  auVar47 = auVar40;
  if (__n < 0x11) goto LAB_00105c46;
  auVar47 = *pauVar20;
  pauVar20 = pauVar20 + 1;
  *(undefined1 (*) [16])output = auVar40 ^ auVar47;
  output = (void *)((long)output + 0x10);
  __n = __n - 0x10;
switchD_00105b79_caseD_3:
  auVar47 = auVar42;
  if (__n < 0x11) goto LAB_00105c46;
  auVar47 = *pauVar20;
  pauVar20 = pauVar20 + 1;
  *(undefined1 (*) [16])output = auVar42 ^ auVar47;
  output = (void *)((long)output + 0x10);
  __n = __n - 0x10;
switchD_00105b79_caseD_4:
  auVar47 = auVar44;
  if (__n < 0x11) goto LAB_00105c46;
  auVar47 = *pauVar20;
  pauVar20 = pauVar20 + 1;
  *(undefined1 (*) [16])output = auVar44 ^ auVar47;
  output = (void *)((long)output + 0x10);
  __n = __n - 0x10;
switchD_00105b79_caseD_5:
  auVar47 = auVar48;
  if (__n < 0x11) goto LAB_00105c46;
  auVar46 = *pauVar20;
  pauVar20 = pauVar20 + 1;
  *(undefined1 (*) [16])output = auVar48 ^ auVar46;
  output = (void *)((long)output + 0x10);
  __n = __n - 0x10;
  lVar26 = 0;
  bVar13 = false;
  goto LAB_00105602;
}

Assistant:

int ptls_fusion_aesgcm_decrypt(ptls_fusion_aesgcm_context_t *_ctx, void *output, const void *input, size_t inlen, __m128i ctr,
                               const void *_aad, size_t aadlen, const void *tag)
{
    struct ptls_fusion_aesgcm_context128 *ctx = (void *)_ctx;
    __m128i ek0 = _mm_setzero_si128(), bits0, bits1 = _mm_setzero_si128(), bits2 = _mm_setzero_si128(), bits3 = _mm_setzero_si128(),
            bits4 = _mm_setzero_si128(), bits5 = _mm_setzero_si128();
    struct ptls_fusion_gfmul_state128 gstate = {0};
    __m128i gdatabuf[6];
    __m128i ac = _mm_shuffle_epi8(_mm_set_epi32(0, (int)aadlen * 8, 0, (int)inlen * 8), byteswap128);
    struct ptls_fusion_aesgcm_ghash_precompute128 *ghash_precompute = ctx->ghash + (aadlen + 15) / 16 + (inlen + 15) / 16 + 1;

    const __m128i *gdata; // points to the elements fed into GHASH
    size_t gdata_cnt;

    const __m128i *src_ghash = input, *src_aes = input, *aad = _aad;
    __m128i *dst = output;
    size_t nondata_aes_cnt = 0, src_ghashlen = inlen, src_aeslen = inlen;

    /* schedule ek0 and suppkey */
    ctr = _mm_add_epi64(ctr, one8);
    bits0 = _mm_xor_si128(_mm_shuffle_epi8(ctr, byteswap128), ctx->super.ecb.keys.m128[0]);
    ++nondata_aes_cnt;

#define STATE_IS_FIRST_RUN 0x1
#define STATE_GHASH_HAS_MORE 0x2
    int state = STATE_IS_FIRST_RUN | STATE_GHASH_HAS_MORE;

    /* the main loop */
    while (1) {

        /* setup gdata */
        if (PTLS_UNLIKELY(aadlen != 0)) {
            gdata = gdatabuf;
            gdata_cnt = 0;
            while (gdata_cnt < 6) {
                if (aadlen < 16) {
                    if (aadlen != 0) {
                        gdatabuf[gdata_cnt++] = loadn128(aad, aadlen);
                        aadlen = 0;
                        ++nondata_aes_cnt;
                    }
                    goto GdataFillSrc;
                }
                gdatabuf[gdata_cnt++] = _mm_loadu_si128(aad++);
                aadlen -= 16;
                ++nondata_aes_cnt;
            }
        } else if (PTLS_LIKELY(src_ghashlen >= 6 * 16)) {
            gdata = src_ghash;
            gdata_cnt = 6;
            src_ghash += 6;
            src_ghashlen -= 6 * 16;
        } else {
            gdata = gdatabuf;
            gdata_cnt = 0;
        GdataFillSrc:
            while (gdata_cnt < 6) {
                if (src_ghashlen < 16) {
                    if (src_ghashlen != 0) {
                        gdatabuf[gdata_cnt++] = loadn128(src_ghash, src_ghashlen);
                        src_ghash = (__m128i *)((uint8_t *)src_ghash + src_ghashlen);
                        src_ghashlen = 0;
                    }
                    if (gdata_cnt < 6 && (state & STATE_GHASH_HAS_MORE) != 0) {
                        gdatabuf[gdata_cnt++] = ac;
                        state &= ~STATE_GHASH_HAS_MORE;
                    }
                    break;
                }
                gdatabuf[gdata_cnt++] = _mm_loadu_si128(src_ghash++);
                src_ghashlen -= 16;
            }
        }

        /* setup aes bits */
        if (PTLS_LIKELY(nondata_aes_cnt == 0))
            goto InitAllBits;
        switch (nondata_aes_cnt) {
#define INIT_BITS(n, keys)                                                                                                         \
    case n:                                                                                                                        \
        ctr = _mm_add_epi64(ctr, one8);                                                                                            \
        bits##n = _mm_xor_si128(_mm_shuffle_epi8(ctr, byteswap128), keys.m128[0]);
        InitAllBits:
            INIT_BITS(0, ctx->super.ecb.keys);
            INIT_BITS(1, ctx->super.ecb.keys);
            INIT_BITS(2, ctx->super.ecb.keys);
            INIT_BITS(3, ctx->super.ecb.keys);
            INIT_BITS(4, ctx->super.ecb.keys);
            INIT_BITS(5, ctx->super.ecb.keys);
#undef INIT_BITS
        }

        { /* run aes and ghash */
#define AESECB6_UPDATE(i)                                                                                                          \
    do {                                                                                                                           \
        __m128i k = ctx->super.ecb.keys.m128[i];                                                                                   \
        bits0 = _mm_aesenc_si128(bits0, k);                                                                                        \
        bits1 = _mm_aesenc_si128(bits1, k);                                                                                        \
        bits2 = _mm_aesenc_si128(bits2, k);                                                                                        \
        bits3 = _mm_aesenc_si128(bits3, k);                                                                                        \
        bits4 = _mm_aesenc_si128(bits4, k);                                                                                        \
        bits5 = _mm_aesenc_si128(bits5, k);                                                                                        \
    } while (0)

            size_t aesi;
            for (aesi = 1; aesi <= gdata_cnt; ++aesi) {
                AESECB6_UPDATE(aesi);
                gfmul_nextstep128(&gstate, _mm_loadu_si128(gdata++), --ghash_precompute);
            }
            for (; aesi < ctx->super.ecb.rounds; ++aesi)
                AESECB6_UPDATE(aesi);
            __m128i k = ctx->super.ecb.keys.m128[aesi];
            bits0 = _mm_aesenclast_si128(bits0, k);
            bits1 = _mm_aesenclast_si128(bits1, k);
            bits2 = _mm_aesenclast_si128(bits2, k);
            bits3 = _mm_aesenclast_si128(bits3, k);
            bits4 = _mm_aesenclast_si128(bits4, k);
            bits5 = _mm_aesenclast_si128(bits5, k);

#undef AESECB6_UPDATE
        }

        /* apply aes bits */
        if (PTLS_LIKELY(nondata_aes_cnt == 0 && src_aeslen >= 6 * 16)) {
#define APPLY(i) _mm_storeu_si128(dst + i, _mm_xor_si128(_mm_loadu_si128(src_aes + i), bits##i))
            APPLY(0);
            APPLY(1);
            APPLY(2);
            APPLY(3);
            APPLY(4);
            APPLY(5);
#undef APPLY
            dst += 6;
            src_aes += 6;
            src_aeslen -= 6 * 16;
        } else {
            if ((state & STATE_IS_FIRST_RUN) != 0) {
                ek0 = bits0;
                state &= ~STATE_IS_FIRST_RUN;
            }
            switch (nondata_aes_cnt) {
#define APPLY(i)                                                                                                                   \
    case i:                                                                                                                        \
        if (PTLS_LIKELY(src_aeslen > 16)) {                                                                                        \
            _mm_storeu_si128(dst++, _mm_xor_si128(_mm_loadu_si128(src_aes++), bits##i));                                           \
            src_aeslen -= 16;                                                                                                      \
        } else {                                                                                                                   \
            bits0 = bits##i;                                                                                                       \
            goto Finish;                                                                                                           \
        }
                APPLY(0);
                APPLY(1);
                APPLY(2);
                APPLY(3);
                APPLY(4);
                APPLY(5);
#undef APPLY
            }
            nondata_aes_cnt = 0;
        }
    }

Finish:
    if (src_aeslen == 16) {
        _mm_storeu_si128(dst, _mm_xor_si128(_mm_loadu_si128(src_aes), bits0));
    } else if (src_aeslen != 0) {
        storen128(dst, src_aeslen, _mm_xor_si128(loadn128(src_aes, src_aeslen), bits0));
    }

    assert((state & STATE_IS_FIRST_RUN) == 0);

    /* the only case where AES operation is complete and GHASH is not is when the application of AC is remaining */
    if ((state & STATE_GHASH_HAS_MORE) != 0) {
        assert(ghash_precompute - 1 == ctx->ghash);
        gfmul_nextstep128(&gstate, ac, --ghash_precompute);
    }

    gfmul_reduce128(&gstate);
    __m128i calctag = gfmul_get_tag128(&gstate, ek0);

    return _mm_movemask_epi8(_mm_cmpeq_epi8(calctag, _mm_loadu_si128(tag))) == 0xffff;

#undef STATE_IS_FIRST_RUN
#undef STATE_GHASH_HAS_MORE
}